

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsSampled.cpp
# Opt level: O1

void __thiscall
vkt::sparse::SparseShaderIntrinsicsCaseSampledBase::initPrograms
          (SparseShaderIntrinsicsCaseSampledBase *this,SourceCollections *programCollection)

{
  TextureFormat *format;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ImageType imageType;
  deUint32 dVar2;
  ProgramSources *pPVar3;
  ostream *poVar4;
  SpirVAsmSource *src;
  TextureFormat *format_00;
  TextureFormat *format_01;
  string typeImgCompVec4;
  string typeImgComp;
  string coordString;
  ostringstream fs;
  ostringstream vs;
  string local_450;
  undefined1 local_430 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  string local_408;
  SourceCollections *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  long *local_3c0 [2];
  long local_3b0 [2];
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  long *local_360 [2];
  long local_350 [2];
  string local_340;
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [6];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_3e8 = programCollection;
  dVar2 = getNumLayers((this->super_SparseShaderIntrinsicsCaseBase).m_imageType,
                       &(this->super_SparseShaderIntrinsicsCaseBase).m_imageSize);
  imageType = (this->super_SparseShaderIntrinsicsCaseBase).m_imageType;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"%local_texCoord_x","");
  local_320._0_8_ = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"%local_texCoord_xy","");
  local_430._0_8_ = &local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"%local_texCoord_xyz","");
  getShaderImageCoordinates(&local_340,imageType,local_1a8,(string *)local_320,(string *)local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ != &local_420) {
    operator_delete((void *)local_430._0_8_,local_420._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_,local_310[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 440\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  highp vec2 vs_in_position;\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 1) in  highp vec2 vs_in_texCoord;\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out highp vec3 vs_out_texCoord;\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvec4  gl_Position;\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tgl_Position\t\t= vec4(vs_in_position, 0.0f, 1.0f);\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tvs_out_texCoord = vec3(vs_in_texCoord, 0.0f);\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_430._0_8_ = &local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"vertex_shader","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&local_3e8->glslSources,(string *)local_430);
  std::__cxx11::stringbuf::str();
  local_320._0_8_ = local_320._0_8_ & 0xffffffff00000000;
  local_320._8_8_ = local_310[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_320 + 8),local_450._M_dataplus._M_p,
             local_450._M_dataplus._M_p + local_450._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + (local_320._0_8_ & 0xffffffff),(value_type *)(local_320 + 8));
  if ((char *)local_320._8_8_ != local_310[0]._M_local_buf + 8) {
    operator_delete((void *)local_320._8_8_,local_310[0]._8_8_ + 1);
  }
  paVar1 = &local_450.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != paVar1) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ != &local_420) {
    operator_delete((void *)local_430._0_8_,local_420._M_allocated_capacity + 1);
  }
  if (1 < dVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 440\n",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"layout(triangles) in;\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"layout(triangle_strip, max_vertices = ",0x26);
    poVar4 = (ostream *)std::ostream::operator<<(local_320,dVar2 * 3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") out;\n",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"in gl_PerVertex {\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tvec4  gl_Position;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"} gl_in[];\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"out gl_PerVertex {\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tvec4  gl_Position;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"};\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"layout(location = 0) in  highp vec3 gs_in_texCoord[];\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"layout(location = 0) out highp vec3 gs_out_texCoord;\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"    for (int layerNdx = 0; layerNdx < ",0x26);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; ++layerNdx)\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    {\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\t\tfor (int vertexNdx = 0; vertexNdx < gl_in.length(); ++vertexNdx)\n",0x43)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t{\n",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\t\t\tgl_Layer\t\t= layerNdx;\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\t\t\tgl_Position\t\t= gl_in[vertexNdx].gl_Position;\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "\t\t\tgs_out_texCoord = vec3(gs_in_texCoord[vertexNdx].xy, float(layerNdx));\n",0x4a
              );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t\tEmitVertex();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t}\n",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\tEndPrimitive();\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    }\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    local_450._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"geometry_shader","");
    pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add(&local_3e8->glslSources,&local_450);
    std::__cxx11::stringbuf::str();
    local_430._0_4_ = 2;
    local_430._8_8_ = local_420._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_430 + 8),local_408._M_dataplus._M_p,
               local_408._M_dataplus._M_p + local_408._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar3->sources + (local_430._0_8_ & 0xffffffff),(value_type *)(local_430 + 8));
    if ((char *)local_430._8_8_ != local_420._M_local_buf + 8) {
      operator_delete((void *)local_430._8_8_,local_420._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != paVar1) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  format = &(this->super_SparseShaderIntrinsicsCaseBase).m_format;
  getImageComponentTypeName_abi_cxx11_((string *)local_430,(sparse *)format,format_00);
  getImageComponentVec4TypeName_abi_cxx11_(&local_450,(sparse *)format,format_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpCapability Shader\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpCapability SampledCubeArray\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpCapability ImageCubeArray\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpCapability SparseResidency\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpCapability StorageImageExtendedFormats\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"%ext_import = OpExtInstImport \"GLSL.std.450\"\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpMemoryModel Logical GLSL450\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "OpEntryPoint Fragment %func_main \"main\" %varying_texCoord %output_texel %output_residency\n"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpExecutionMode %func_main OriginUpperLeft\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpSource GLSL 440\n",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpName %func_main \"main\"\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpName %varying_texCoord \"varying_texCoord\"\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpName %output_texel \"out_texel\"\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpName %output_residency \"out_residency\"\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpName %type_uniformblock \"LodBlock\"\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpMemberName %type_uniformblock 0 \"lod\"\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpMemberName %type_uniformblock 1 \"size\"\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpName %uniformblock_instance \"lodInstance\"\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpName %uniformconst_image_sparse \"u_imageSparse\"\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpDecorate %varying_texCoord Location 0\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpDecorate %output_texel\t Location 0\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpDecorate %output_residency Location 1\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpDecorate\t\t %type_uniformblock Block\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpMemberDecorate %type_uniformblock 0 Offset 0\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpMemberDecorate %type_uniformblock 1 Offset 8\n",0x2f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpDecorate %uniformconst_image_sparse DescriptorSet 0\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"OpDecorate %uniformconst_image_sparse Binding ",0x2e);
  poVar4 = (ostream *)std::ostream::operator<<(local_320,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%type_void = OpTypeVoid\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_void_func = OpTypeFunction %type_void\n",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_bool\t\t\t\t\t\t\t= OpTypeBool\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_int\t\t\t\t\t\t\t= OpTypeInt 32 1\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_uint\t\t\t\t\t\t\t= OpTypeInt 32 0\n",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_float\t\t\t\t\t\t\t= OpTypeFloat 32\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_vec2\t\t\t\t\t\t\t= OpTypeVector %type_float 2\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_vec3\t\t\t\t\t\t\t= OpTypeVector %type_float 3\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_vec4\t\t\t\t\t\t\t= OpTypeVector %type_float 4\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_ivec4\t\t\t\t\t\t= OpTypeVector %type_int  4\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_uvec4\t\t\t\t\t\t= OpTypeVector %type_uint 4\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_uniformblock\t\t\t\t\t= OpTypeStruct %type_uint %type_vec2\n",0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_struct_int_img_comp_vec4\t= OpTypeStruct %type_int ",0x38);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_450._M_dataplus._M_p,local_450._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_input_vec3\t\t\t\t\t= OpTypePointer Input %type_vec3\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_input_float\t\t\t\t\t= OpTypePointer Input %type_float\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_output_img_comp_vec4\t\t\t= OpTypePointer Output ",0x34);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_450._M_dataplus._M_p,local_450._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_output_uint\t\t\t\t\t= OpTypePointer Output %type_uint\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_function_int\t\t\t\t\t= OpTypePointer Function %type_int\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_function_img_comp_vec4\t\t= OpTypePointer Function ",0x37);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_450._M_dataplus._M_p,local_450._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%type_function_int_img_comp_vec4\t= OpTypePointer Function %type_struct_int_img_comp_vec4\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%type_pushconstant_uniformblock\t\t\t\t= OpTypePointer PushConstant %type_uniformblock\n"
             ,0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%type_pushconstant_uniformblock_member_lod  = OpTypePointer PushConstant %type_uint\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%type_pushconstant_uniformblock_member_size = OpTypePointer PushConstant %type_vec2\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%type_image_sparse\t\t\t\t= ",0x18);
  getOpTypeImageSparse
            (&local_408,(this->super_SparseShaderIntrinsicsCaseBase).m_imageType,format,
             (string *)local_430,true);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_408._M_dataplus._M_p,local_408._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%type_sampled_image_sparse\t\t= OpTypeSampledImage %type_image_sparse\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_sampled_image_sparse\n"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%varying_texCoord\t\t\t= OpVariable %type_input_vec3 Input\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%output_texel\t\t\t\t= OpVariable %type_output_img_comp_vec4 Output\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%output_residency\t\t\t= OpVariable %type_output_uint Output\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%uniformconst_image_sparse\t= OpVariable %type_uniformconst_image_sparse UniformConstant\n"
             ,0x58);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%uniformblock_instance  = OpVariable %type_pushconstant_uniformblock PushConstant\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_uint_0\t\t\t\t= OpConstant %type_uint 0\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_uint_1\t\t\t\t= OpConstant %type_uint 1\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_uint_2\t\t\t\t= OpConstant %type_uint 2\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_uint_3\t\t\t\t= OpConstant %type_uint 3\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_int_0\t\t\t\t\t= OpConstant %type_int  0\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_int_1\t\t\t\t\t= OpConstant %type_int  1\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_int_2\t\t\t\t\t= OpConstant %type_int  2\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_int_3\t\t\t\t\t= OpConstant %type_int  3\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_float_0\t\t\t\t= OpConstant %type_float 0.0\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_float_half\t\t\t= OpConstant %type_float 0.5\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_texel_resident\t\t= OpConstant %type_uint ",0x32);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%constant_texel_not_resident\t= OpConstant %type_uint ",0x35);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%func_main\t\t = OpFunction %type_void None %type_void_func\n",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"%label_func_main = OpLabel\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_image_sparse = OpLoad %type_sampled_image_sparse %uniformconst_image_sparse\n",
             0x53);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%texCoord = OpLoad %type_vec3 %varying_texCoord\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%local_texCoord_x = OpCompositeExtract %type_float %texCoord 0\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%local_texCoord_y = OpCompositeExtract %type_float %texCoord 1\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%local_texCoord_z = OpCompositeExtract %type_float %texCoord 2\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_texCoord_xy\t= OpCompositeConstruct %type_vec2 %local_texCoord_x %local_texCoord_y\n"
             ,0x59);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_texCoord_xyz = OpCompositeConstruct %type_vec3 %local_texCoord_x %local_texCoord_y %local_texCoord_z\n"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%access_uniformblock_member_uint_lod = OpAccessChain %type_pushconstant_uniformblock_member_lod %uniformblock_instance %constant_int_0\n"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_uniformblock_member_uint_lod  = OpLoad %type_uint %access_uniformblock_member_uint_lod\n"
             ,0x5e);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_uniformblock_member_float_lod = OpConvertUToF %type_float %local_uniformblock_member_uint_lod\n"
             ,0x65);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%access_uniformblock_member_size\t = OpAccessChain %type_pushconstant_uniformblock_member_size %uniformblock_instance %constant_int_1\n"
             ,0x85);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_uniformblock_member_size\t\t = OpLoad %type_vec2 %access_uniformblock_member_size\n"
             ,0x57);
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"%local_sparse_op_result","");
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,"%type_struct_int_img_comp_vec4","");
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"%local_image_sparse","");
  local_360[0] = local_350;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_360,"%local_uniformblock_member_float_lod","");
  (*(this->super_SparseShaderIntrinsicsCaseBase).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode[7])(&local_3e0,this,local_3c0,local_380,local_3a0,&local_340,(string *)local_360)
  ;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%local_img_comp_vec4 = OpCompositeExtract ",0x2a);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_450._M_dataplus._M_p,local_450._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %local_sparse_op_result 1\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"OpStore %output_texel %local_img_comp_vec4\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n",0x4f
            );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
             ,0x55);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"OpSelectionMerge %branch_texel_resident None\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
             ,0x5a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%label_texel_resident = OpLabel\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"OpStore %output_residency %constant_texel_resident\n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"OpBranch %branch_texel_resident\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%label_texel_not_resident = OpLabel\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"OpStore %output_residency %constant_texel_not_resident\n",0x37);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"OpBranch %branch_texel_resident\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"%branch_texel_resident = OpLabel\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"OpReturn\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"OpFunctionEnd\n",0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (local_3a0[0] != local_390) {
    operator_delete(local_3a0[0],local_390[0] + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  if (local_3c0[0] != local_3b0) {
    operator_delete(local_3c0[0],local_3b0[0] + 1);
  }
  paVar1 = &local_408.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  local_408._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"fragment_shader","");
  src = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(&local_3e8->spirvAsmSources,&local_408);
  std::__cxx11::stringbuf::str();
  ::vk::operator<<(src,&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != paVar1) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._0_8_ != &local_420) {
    operator_delete((void *)local_430._0_8_,local_420._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SparseShaderIntrinsicsCaseSampledBase::initPrograms (vk::SourceCollections& programCollection) const
{
	const deUint32		numLayers	= getNumLayers(m_imageType, m_imageSize);
	const std::string	coordString = getShaderImageCoordinates(m_imageType, "%local_texCoord_x", "%local_texCoord_xy", "%local_texCoord_xyz");

	// Create vertex shader
	std::ostringstream vs;

	vs	<< "#version 440\n"
		<< "layout(location = 0) in  highp vec2 vs_in_position;\n"
		<< "layout(location = 1) in  highp vec2 vs_in_texCoord;\n"
		<< "\n"
		<< "layout(location = 0) out highp vec3 vs_out_texCoord;\n"
		<< "\n"
		<< "out gl_PerVertex {\n"
		<< "	vec4  gl_Position;\n"
		<< "};\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position		= vec4(vs_in_position, 0.0f, 1.0f);\n"
		<< "	vs_out_texCoord = vec3(vs_in_texCoord, 0.0f);\n"
		<< "}\n";

	programCollection.glslSources.add("vertex_shader") << glu::VertexSource(vs.str());

	if (numLayers > 1u)
	{
		const deInt32 maxVertices = 3u * numLayers;

		// Create geometry shader
		std::ostringstream gs;

		gs << "#version 440\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = " << static_cast<deInt32>(maxVertices) << ") out;\n"
			<< "\n"
			<< "in gl_PerVertex {\n"
			<< "	vec4  gl_Position;\n"
			<< "} gl_in[];\n"
			<< "out gl_PerVertex {\n"
			<< "	vec4  gl_Position;\n"
			<< "};\n"
			<< "layout(location = 0) in  highp vec3 gs_in_texCoord[];\n"
			<< "\n"
			<< "layout(location = 0) out highp vec3 gs_out_texCoord;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    for (int layerNdx = 0; layerNdx < " << static_cast<deInt32>(numLayers) << "; ++layerNdx)\n"
			<< "    {\n"
			<< "		for (int vertexNdx = 0; vertexNdx < gl_in.length(); ++vertexNdx)\n"
			<< "		{\n"
			<< "			gl_Layer		= layerNdx;\n"
			<< "			gl_Position		= gl_in[vertexNdx].gl_Position;\n"
			<< "			gs_out_texCoord = vec3(gs_in_texCoord[vertexNdx].xy, float(layerNdx));\n"
			<< "			EmitVertex();\n"
			<< "		}\n"
			<< "		EndPrimitive();\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("geometry_shader") << glu::GeometrySource(gs.str());
	}

	// Create fragment shader
	std::ostringstream fs;

	const std::string	typeImgComp		= getImageComponentTypeName(m_format);
	const std::string	typeImgCompVec4	= getImageComponentVec4TypeName(m_format);

	fs	<< "OpCapability Shader\n"
		<< "OpCapability SampledCubeArray\n"
		<< "OpCapability ImageCubeArray\n"
		<< "OpCapability SparseResidency\n"
		<< "OpCapability StorageImageExtendedFormats\n"

		<< "%ext_import = OpExtInstImport \"GLSL.std.450\"\n"
		<< "OpMemoryModel Logical GLSL450\n"
		<< "OpEntryPoint Fragment %func_main \"main\" %varying_texCoord %output_texel %output_residency\n"
		<< "OpExecutionMode %func_main OriginUpperLeft\n"
		<< "OpSource GLSL 440\n"

		<< "OpName %func_main \"main\"\n"

		<< "OpName %varying_texCoord \"varying_texCoord\"\n"

		<< "OpName %output_texel \"out_texel\"\n"
		<< "OpName %output_residency \"out_residency\"\n"

		<< "OpName %type_uniformblock \"LodBlock\"\n"
		<< "OpMemberName %type_uniformblock 0 \"lod\"\n"
		<< "OpMemberName %type_uniformblock 1 \"size\"\n"
		<< "OpName %uniformblock_instance \"lodInstance\"\n"

		<< "OpName %uniformconst_image_sparse \"u_imageSparse\"\n"

		<< "OpDecorate %varying_texCoord Location 0\n"

		<< "OpDecorate %output_texel	 Location 0\n"
		<< "OpDecorate %output_residency Location 1\n"

		<< "OpDecorate		 %type_uniformblock Block\n"
		<< "OpMemberDecorate %type_uniformblock 0 Offset 0\n"
		<< "OpMemberDecorate %type_uniformblock 1 Offset 8\n"

		<< "OpDecorate %uniformconst_image_sparse DescriptorSet 0\n"
		<< "OpDecorate %uniformconst_image_sparse Binding " << BINDING_IMAGE_SPARSE << "\n"

		<< "%type_void = OpTypeVoid\n"
		<< "%type_void_func = OpTypeFunction %type_void\n"

		<< "%type_bool							= OpTypeBool\n"
		<< "%type_int							= OpTypeInt 32 1\n"
		<< "%type_uint							= OpTypeInt 32 0\n"
		<< "%type_float							= OpTypeFloat 32\n"
		<< "%type_vec2							= OpTypeVector %type_float 2\n"
		<< "%type_vec3							= OpTypeVector %type_float 3\n"
		<< "%type_vec4							= OpTypeVector %type_float 4\n"
		<< "%type_ivec4						= OpTypeVector %type_int  4\n"
		<< "%type_uvec4						= OpTypeVector %type_uint 4\n"
		<< "%type_uniformblock					= OpTypeStruct %type_uint %type_vec2\n"
		<< "%type_struct_int_img_comp_vec4	= OpTypeStruct %type_int " << typeImgCompVec4 << "\n"

		<< "%type_input_vec3					= OpTypePointer Input %type_vec3\n"
		<< "%type_input_float					= OpTypePointer Input %type_float\n"

		<< "%type_output_img_comp_vec4			= OpTypePointer Output " << typeImgCompVec4 << "\n"
		<< "%type_output_uint					= OpTypePointer Output %type_uint\n"

		<< "%type_function_int					= OpTypePointer Function %type_int\n"
		<< "%type_function_img_comp_vec4		= OpTypePointer Function " << typeImgCompVec4 << "\n"
		<< "%type_function_int_img_comp_vec4	= OpTypePointer Function %type_struct_int_img_comp_vec4\n"

		<< "%type_pushconstant_uniformblock				= OpTypePointer PushConstant %type_uniformblock\n"
		<< "%type_pushconstant_uniformblock_member_lod  = OpTypePointer PushConstant %type_uint\n"
		<< "%type_pushconstant_uniformblock_member_size = OpTypePointer PushConstant %type_vec2\n"

		<< "%type_image_sparse				= " << getOpTypeImageSparse(m_imageType, m_format, typeImgComp, true) << "\n"
		<< "%type_sampled_image_sparse		= OpTypeSampledImage %type_image_sparse\n"
		<< "%type_uniformconst_image_sparse = OpTypePointer UniformConstant %type_sampled_image_sparse\n"

		<< "%varying_texCoord			= OpVariable %type_input_vec3 Input\n"

		<< "%output_texel				= OpVariable %type_output_img_comp_vec4 Output\n"
		<< "%output_residency			= OpVariable %type_output_uint Output\n"

		<< "%uniformconst_image_sparse	= OpVariable %type_uniformconst_image_sparse UniformConstant\n"

		<< "%uniformblock_instance  = OpVariable %type_pushconstant_uniformblock PushConstant\n"

		// Declare constants
		<< "%constant_uint_0				= OpConstant %type_uint 0\n"
		<< "%constant_uint_1				= OpConstant %type_uint 1\n"
		<< "%constant_uint_2				= OpConstant %type_uint 2\n"
		<< "%constant_uint_3				= OpConstant %type_uint 3\n"
		<< "%constant_int_0					= OpConstant %type_int  0\n"
		<< "%constant_int_1					= OpConstant %type_int  1\n"
		<< "%constant_int_2					= OpConstant %type_int  2\n"
		<< "%constant_int_3					= OpConstant %type_int  3\n"
		<< "%constant_float_0				= OpConstant %type_float 0.0\n"
		<< "%constant_float_half			= OpConstant %type_float 0.5\n"
		<< "%constant_texel_resident		= OpConstant %type_uint " << MEMORY_BLOCK_BOUND_VALUE << "\n"
		<< "%constant_texel_not_resident	= OpConstant %type_uint " << MEMORY_BLOCK_NOT_BOUND_VALUE << "\n"

		// Call main function
		<< "%func_main		 = OpFunction %type_void None %type_void_func\n"
		<< "%label_func_main = OpLabel\n"

		<< "%local_image_sparse = OpLoad %type_sampled_image_sparse %uniformconst_image_sparse\n"

		<< "%texCoord = OpLoad %type_vec3 %varying_texCoord\n"

		<< "%local_texCoord_x = OpCompositeExtract %type_float %texCoord 0\n"
		<< "%local_texCoord_y = OpCompositeExtract %type_float %texCoord 1\n"
		<< "%local_texCoord_z = OpCompositeExtract %type_float %texCoord 2\n"

		<< "%local_texCoord_xy	= OpCompositeConstruct %type_vec2 %local_texCoord_x %local_texCoord_y\n"
		<< "%local_texCoord_xyz = OpCompositeConstruct %type_vec3 %local_texCoord_x %local_texCoord_y %local_texCoord_z\n"

		<< "%access_uniformblock_member_uint_lod = OpAccessChain %type_pushconstant_uniformblock_member_lod %uniformblock_instance %constant_int_0\n"
		<< "%local_uniformblock_member_uint_lod  = OpLoad %type_uint %access_uniformblock_member_uint_lod\n"
		<< "%local_uniformblock_member_float_lod = OpConvertUToF %type_float %local_uniformblock_member_uint_lod\n"
		<< "%access_uniformblock_member_size	 = OpAccessChain %type_pushconstant_uniformblock_member_size %uniformblock_instance %constant_int_1\n"
		<< "%local_uniformblock_member_size		 = OpLoad %type_vec2 %access_uniformblock_member_size\n"

		<< sparseImageOpString("%local_sparse_op_result", "%type_struct_int_img_comp_vec4", "%local_image_sparse", coordString, "%local_uniformblock_member_float_lod") << "\n"

		// Load texel value
		<< "%local_img_comp_vec4 = OpCompositeExtract " << typeImgCompVec4 << " %local_sparse_op_result 1\n"

		<< "OpStore %output_texel %local_img_comp_vec4\n"

		// Load residency code
		<< "%local_residency_code = OpCompositeExtract %type_int %local_sparse_op_result 0\n"

		// Check if loaded texel is placed in resident memory
		<< "%local_texel_resident = OpImageSparseTexelsResident %type_bool %local_residency_code\n"
		<< "OpSelectionMerge %branch_texel_resident None\n"
		<< "OpBranchConditional %local_texel_resident %label_texel_resident %label_texel_not_resident\n"
		<< "%label_texel_resident = OpLabel\n"

		// Loaded texel is in resident memory
		<< "OpStore %output_residency %constant_texel_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%label_texel_not_resident = OpLabel\n"

		// Loaded texel is not in resident memory
		<< "OpStore %output_residency %constant_texel_not_resident\n"

		<< "OpBranch %branch_texel_resident\n"
		<< "%branch_texel_resident = OpLabel\n"

		<< "OpReturn\n"
		<< "OpFunctionEnd\n";

	programCollection.spirvAsmSources.add("fragment_shader") << fs.str();
}